

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  float local_d0;
  int local_cc;
  Student s;
  TUPLE tpl;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  
  p.first = 10;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p.second,"ten",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Ali",(allocator<char> *)&tpl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s.surname,"Kanik",(allocator<char> *)&local_d0);
  s.gpa.value = 4.0;
  s.age.value = 0x16;
  operator<<((ostream *)&std::cout,&s);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&s);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_d0 = 4.0;
  local_cc = 0x16;
  std::_Tuple_impl<0ul,Name,Surname,Gpa,Age>::
  _Tuple_impl<char_const(&)[4],char_const(&)[6],float,int,void>
            ((_Tuple_impl<0ul,Name,Surname,Gpa,Age> *)&tpl,(char (*) [4])"Ali",(char (*) [6])"Kanik"
             ,&local_d0,&local_cc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>::~_Tuple_impl
            (&tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>);
  Student::~Student(&s);
  std::__cxx11::string::~string((string *)&p.second);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto p = Pair<int, std::string>{10, "ten"};

    auto s = Student{"Ali", "Kanik", 4.0f, 22};
    std::cout << s << std::endl;
    std::cout << s.name << std::endl;

    using TUPLE = std::tuple<Name, Surname, Gpa, Age>;
    auto tpl = TUPLE("Ali", "Kanik", 4.0f, 22);
//    auto tpl = std::make_tuple("Ali", 4.0f, 22, 3.5f);

//    std::cout << "!" << is_tuple<Student>::value << std::endl;

    // get the number of dimensions of a TUPLE type at compile-time
    std::cout << std::tuple_size_v<TUPLE> << std::endl;

//    TypeDebug< std::tuple_element_t<3, TUPLE> > a;

//    std::cout << std::get<Surname>(tpl) << std::endl;
//    std::cout << std::get<2>(tpl) << std::endl;

    return 0;
}